

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_he_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  int iVar1;
  void *pvVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  curltime cVar5;
  int local_c4;
  char *pcStack_c0;
  int port;
  char *disphost;
  char *host;
  int is_ipv6;
  ip_quadruple ipquad;
  CURLcode result;
  cf_he_ctx *ctx;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar2 = cf->ctx;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  *done = false;
  iVar1 = *(int *)((long)pvVar2 + 0x18);
  if (iVar1 == 0) {
    CVar3 = start_connect(cf,data,*(Curl_dns_entry **)((long)pvVar2 + 0x10));
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    *(undefined4 *)((long)pvVar2 + 0x18) = 1;
  }
  else if (iVar1 != 1) {
    if (iVar1 != 2) {
      return CURLE_OK;
    }
    *done = true;
    return CURLE_OK;
  }
  CVar3 = is_connected(cf,data,done);
  if ((CVar3 == CURLE_OK) && ((*done & 1U) != 0)) {
    *(undefined4 *)((long)pvVar2 + 0x18) = 2;
    cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    cf->next = *(Curl_cfilter **)(*(long *)((long)pvVar2 + 0x30) + 0x28);
    *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + 0x28) = 0;
    cf_he_ctx_clear(cf,data);
    if ((cf->conn->handler->protocol & 0x30) != 0) {
      cVar5 = Curl_pgrsTime(data,TIMER_APPCONNECT);
      ipquad._92_8_ = cVar5.tv_sec;
    }
    if ((((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)) &&
                 (CVar4 = Curl_conn_cf_get_ip_info
                                    (cf->next,data,(int *)&host,(ip_quadruple *)((long)&host + 4)),
                 CVar4 == CURLE_OK)) &&
                (((*cf->next->cft->get_host)
                            (cf->next,data,&disphost,&stack0xffffffffffffff40,&local_c4),
                 data != (Curl_easy *)0x0 && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)
                 ))))) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"Connected to %s (%s) port %u",pcStack_c0,(long)&host + 4,
                        (ulong)(uint)ipquad.local_ip._38_4_);
    }
    (data->info).numconnects = (data->info).numconnects + 1;
  }
  return CVar3;
}

Assistant:

static CURLcode cf_he_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  DEBUGASSERT(ctx);
  *done = FALSE;

  switch(ctx->state) {
    case SCFST_INIT:
      DEBUGASSERT(CURL_SOCKET_BAD == Curl_conn_cf_get_socket(cf, data));
      DEBUGASSERT(!cf->connected);
      result = start_connect(cf, data, ctx->remotehost);
      if(result)
        return result;
      ctx->state = SCFST_WAITING;
      FALLTHROUGH();
    case SCFST_WAITING:
      result = is_connected(cf, data, done);
      if(!result && *done) {
        DEBUGASSERT(ctx->winner);
        DEBUGASSERT(ctx->winner->cf);
        DEBUGASSERT(ctx->winner->cf->connected);
        /* we have a winner. Install and activate it.
         * close/free all others. */
        ctx->state = SCFST_DONE;
        cf->connected = TRUE;
        cf->next = ctx->winner->cf;
        ctx->winner->cf = NULL;
        cf_he_ctx_clear(cf, data);

        if(cf->conn->handler->protocol & PROTO_FAMILY_SSH)
          Curl_pgrsTime(data, TIMER_APPCONNECT); /* we are connected already */
        if(Curl_trc_cf_is_verbose(cf, data)) {
          struct ip_quadruple ipquad;
          int is_ipv6;
          if(!Curl_conn_cf_get_ip_info(cf->next, data, &is_ipv6, &ipquad)) {
            const char *host, *disphost;
            int port;
            cf->next->cft->get_host(cf->next, data, &host, &disphost, &port);
            CURL_TRC_CF(data, cf, "Connected to %s (%s) port %u",
                        disphost, ipquad.remote_ip, ipquad.remote_port);
          }
        }
        data->info.numconnects++; /* to track the # of connections made */
      }
      break;
    case SCFST_DONE:
      *done = TRUE;
      break;
  }
  return result;
}